

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

string * phosg::JSON::escape_string(string *__return_storage_ptr__,string *s,StringEscapeMode mode)

{
  byte __c;
  pointer pcVar1;
  size_type sVar2;
  char *__s;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  sVar3 = 0;
  do {
    if (sVar2 == sVar3) {
      return __return_storage_ptr__;
    }
    __c = pcVar1[sVar3];
    switch(__c) {
    case 8:
      __s = "\\b";
      break;
    case 9:
      __s = "\\t";
      break;
    case 10:
      __s = "\\n";
      break;
    case 0xb:
switchD_0011b99b_caseD_b:
      if (__c < 0x20) {
        if (mode == STANDARD) {
          string_printf_abi_cxx11_(&local_50,"\\u%04hhX");
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&local_50);
        }
        else {
          string_printf_abi_cxx11_(&local_50,"\\x%02hhX");
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,&local_50);
        }
LAB_0011bab0:
        ::std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        if ((0x7e < __c) && (mode != CONTROL_ONLY)) {
          if (mode == HEX) {
            string_printf_abi_cxx11_(&local_50,"\\x%02hhX");
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(__return_storage_ptr__,&local_50);
          }
          else {
            string_printf_abi_cxx11_(&local_50,"\\u%04hhX");
            ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append(__return_storage_ptr__,&local_50);
          }
          goto LAB_0011bab0;
        }
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,__c);
      }
      goto LAB_0011ba23;
    case 0xc:
      __s = "\\f";
      break;
    case 0xd:
      __s = "\\r";
      break;
    default:
      __s = "\\\\";
      if (__c != 0x5c) {
        if (__c != 0x22) goto switchD_0011b99b_caseD_b;
        __s = "\\\"";
      }
    }
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,__s);
LAB_0011ba23:
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

string JSON::escape_string(const string& s, StringEscapeMode mode) {
  string ret;
  for (auto ch : s) {
    if (ch == '\"') {
      ret += "\\\"";
    } else if (ch == '\\') {
      ret += "\\\\";
    } else if (ch == '\b') {
      ret += "\\b";
    } else if (ch == '\f') {
      ret += "\\f";
    } else if (ch == '\n') {
      ret += "\\n";
    } else if (ch == '\r') {
      ret += "\\r";
    } else if (ch == '\t') {
      ret += "\\t";
    } else if (static_cast<uint8_t>(ch) < 0x20) {
      if (mode != StringEscapeMode::STANDARD) {
        ret += string_printf("\\x%02hhX", ch);
      } else {
        ret += string_printf("\\u%04hhX", ch);
      }
    } else if (static_cast<uint8_t>(ch) > 0x7E) {
      if (mode == StringEscapeMode::CONTROL_ONLY) {
        ret += ch;
      } else if (mode == StringEscapeMode::HEX) {
        ret += string_printf("\\x%02hhX", ch);
      } else {
        ret += string_printf("\\u%04hhX", ch);
      }
    } else {
      ret += ch;
    }
  }
  return ret;
}